

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O2

int __thiscall Am_GIF_Image::process_gif(Am_GIF_Image *this,ifstream *ifs,GIF_Load_Info *gli)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  short j;
  ulong uVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  unsigned_short input_code;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  uint local_61a0;
  ushort local_6198;
  ushort local_6190;
  ushort local_6170;
  uchar buf [256];
  unsigned_short stack [4096];
  unsigned_short suffix [4096];
  unsigned_short prefix [4096];
  
  iVar1 = (this->super_Am_Generic_Image).iminfo.num_colors;
  gli->x = 0;
  gli->y = 0;
  uVar3 = std::istream::get();
  iVar6 = 0;
  if (0xfffffff8 < uVar3 - 9) {
    uVar11 = iVar1 - 1;
    uVar12 = 1 << ((byte)uVar3 & 0x1f);
    uVar3 = uVar3 + 1;
    iVar6 = 1 << ((byte)uVar3 & 0x1f);
    uVar18 = iVar6 - 1;
    uVar17 = 0;
    std::ios::clear((int)*(undefined8 *)(*(long *)ifs + -0x18) + (int)ifs);
    uVar4 = std::istream::get();
    local_6170 = (short)uVar12 + 1;
    uVar13 = 0;
    uVar19 = uVar18;
    local_61a0 = uVar18;
    uVar9 = uVar12 + 2;
    iVar1 = iVar6;
    uVar15 = uVar3;
    while (uVar4 != 0) {
      std::istream::read((char *)ifs,(long)buf);
      if (((byte)ifs[*(long *)(*(long *)ifs + -0x18) + 0x20] & 5) != 0) {
        return 0;
      }
      uVar8 = 0;
      uVar20 = (uint)local_6190;
LAB_001ab8fa:
      if (uVar8 != uVar4) {
        uVar13 = uVar13 | (ulong)buf[uVar8] << ((byte)uVar17 & 0x3f);
        uVar17 = uVar17 + 8;
        do {
          while( true ) {
            if (uVar17 < uVar15) {
              uVar8 = uVar8 + 1;
              goto LAB_001ab8fa;
            }
            uVar21 = local_61a0 & (uint)uVar13;
            uVar13 = uVar13 >> ((byte)uVar15 & 0x3f);
            if ((ushort)uVar21 == local_6170) goto LAB_001abafa;
            if (uVar12 == (uVar21 & 0xffff)) {
              local_61a0 = uVar18;
              uVar20 = 0xffff;
              uVar9 = uVar12 + 2;
              iVar1 = iVar6;
              uVar5 = uVar3;
              goto LAB_001abab8;
            }
            sVar16 = (short)uVar20;
            if (sVar16 != -1) break;
            uVar17 = uVar17 - uVar15;
            uVar19 = uVar21 & uVar11;
            add_to_image(this,gli,(unsigned_short)uVar19);
            uVar20 = uVar21;
          }
          local_6198 = (ushort)uVar9;
          if ((ushort)uVar21 < local_6198) {
            uVar14 = 0;
            uVar20 = uVar21;
          }
          else {
            stack[0] = (ushort)uVar19 & 0xff;
            uVar14 = 1;
          }
          while ((ushort)uVar11 < (ushort)uVar20) {
            if (0xfff < (ushort)uVar20) {
              return 0;
            }
            if (0xffd < uVar14) {
              return 0;
            }
            uVar7 = (ulong)((uVar20 & 0xffff) * 2);
            stack[uVar14] = *(unsigned_short *)((long)suffix + uVar7);
            uVar14 = uVar14 + 1;
            uVar20 = (uint)*(ushort *)((long)prefix + uVar7);
          }
          uVar19 = uVar20 & uVar11;
          uVar5 = (ushort)uVar19 & 0xff;
          stack[uVar14] = uVar5;
          for (; -1 < (short)uVar14; uVar14 = (ulong)((int)uVar14 - 1)) {
            add_to_image(this,gli,stack[uVar14 & 0xffff]);
          }
          uVar14 = (ulong)((uVar9 & 0xffff) * 2);
          *(short *)((long)prefix + uVar14) = sVar16;
          *(ushort *)((long)suffix + uVar14) = uVar5;
          uVar9 = uVar9 + 1;
          bVar22 = (ushort)iVar1 <= (ushort)uVar9;
          bVar23 = uVar15 < 0xc;
          iVar2 = iVar1 * 2;
          iVar10 = iVar1 * 2;
          if (!bVar23 || !bVar22) {
            iVar10 = iVar1;
          }
          uVar5 = uVar15 + (bVar23 && bVar22);
          uVar20 = uVar21;
          iVar1 = iVar10;
          if (bVar23 && bVar22) {
            local_61a0 = iVar2 - 1;
          }
LAB_001abab8:
          uVar17 = uVar17 - uVar15;
          uVar15 = uVar5;
        } while( true );
      }
      local_6190 = (ushort)uVar20;
      uVar4 = std::istream::get();
    }
LAB_001abafa:
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int
Am_GIF_Image::process_gif(std::ifstream &ifs, GIF_Load_Info &gli)
{
  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];
  unsigned short data_mask = iminfo.num_colors - 1;

  unsigned short prefix[GIF_TBLSIZE];
  unsigned short suffix[GIF_TBLSIZE];
  unsigned short stack[GIF_TBLSIZE];

  unsigned short istk = 0;

  gli.x = 0;
  gli.y = 0; // initial values

  // Next byte is the initial number of bits used for LZW codes
  unsigned short init_code_size = ifs.get();

  if (init_code_size < 2 || init_code_size > 8) {
    return 0;
  }

  unsigned short clear_code = 1 << init_code_size;
  unsigned short eoi_code = clear_code + 1;
  unsigned short free_code = clear_code + 2;

  // The GIF specification says that, for decompression, the code
  // size should be one bit longer than the initial code size.
  unsigned short code_size = init_code_size + 1;

  // Bit mask needed to extract data bits corresponding to the
  // code size.
  unsigned short max_code = 1 << code_size;
  unsigned short read_mask = max_code - 1;

  ifs.clear();

  unsigned short bitpos = 0;
  unsigned long val = 0;

  for (unsigned short count = ifs.get(); count > 0; count = ifs.get()) {
    // Read a block of data into the buffer
    // ifs.read(buf, count); MSL
    ifs.read((char *)buf, count);
    if (ifs.fail()) {
      return 0;
    }

    // Process the contents of the buffer
    for (unsigned int i = 0; i < count; i++) {
      const unsigned long tmp = buf[i];
      val |= (tmp << bitpos);
      bitpos += 8;

      while (bitpos >= code_size) {
        unsigned short curcode = (unsigned short)(val & read_mask);
        val >>= code_size;
        bitpos -= code_size;
        if (curcode == eoi_code) {
          return 1;
        }
        unsigned short oldcode;
        unsigned short pixel;
        if (curcode == clear_code) {
          free_code = (1 << init_code_size) + 2;
          code_size = init_code_size + 1;
          max_code = 1 << code_size;
          read_mask = max_code - 1;
          istk = 0;
          oldcode = 0xffff;
        } else {
          if (oldcode == 0xffff) {
            // First code, after initialization, is a raw pixel value
            pixel = curcode & data_mask;
            add_to_image(gli, pixel);
            oldcode = curcode;
          } else {
            const unsigned short input_code = curcode;
            if (curcode >= free_code) {
              // Code is not in table yet. Save last character in stack
              stack[istk++] = (unsigned char)pixel;
              curcode = oldcode;
            }
            while (curcode > data_mask) {
              // [eab] I don't know enough about the LZW algorithm
              // to introduce more precise range tests than the following
              // on curcode and istk
              if (curcode >= GIF_TBLSIZE || istk >= GIF_TBLSIZE - 2) {
                return 0; // corrupt GIF
              }
              // Save bytes corresponding to compression code in stack for
              // later use.
              stack[istk++] = suffix[curcode];
              curcode = prefix[curcode];
            }

            pixel = curcode & data_mask;
            stack[istk++] = (unsigned char)pixel;

            // Add decoded string of bytes to image
            for (short j = istk - 1; j >= 0; j--)
              add_to_image(gli, stack[j]);

            istk = 0;

            // Add current information to decompression tables
            prefix[free_code] = oldcode;
            suffix[free_code] = (unsigned char)pixel;
            oldcode = input_code;

            // Adjust code size, if necessary.
            free_code++;
            if (free_code >= max_code) {
              if (code_size < GIF_MAXCODE) {
                code_size++;
                max_code *= 2;
                read_mask = max_code - 1;
              }
            }
          }
        }
      }
    }
  }
  return 1;
}